

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O0

DdNode * cuddBddCharToVect(DdManager *dd,DdNode *f,DdNode *x)

{
  DdNode *pDVar1;
  DdManager *f_00;
  DdManager *f_01;
  DdNode *g;
  DdNode *h;
  bool bVar2;
  uint local_7c;
  DdNode *E;
  DdNode *T;
  DdNode *fE;
  DdNode *fT;
  DdNode *F;
  DdNode *res;
  DdNode *zero;
  DdNode *one;
  int comple;
  uint level;
  uint topf;
  DdNode *x_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)cuddCacheLookup2(dd,cuddBddCharToVect,f,x);
  if (dd_local == (DdManager *)0x0) {
    pDVar1 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
    if (pDVar1->index == 0x7fffffff) {
      local_7c = pDVar1->index;
    }
    else {
      local_7c = dd->perm[pDVar1->index];
    }
    dd_local = (DdManager *)x;
    if (local_7c <= (uint)dd->perm[x->index]) {
      dd_local = (DdManager *)((ulong)dd->one ^ 1);
      f_00 = (DdManager *)((ulong)(pDVar1->type).kids.T ^ (long)(int)(uint)(pDVar1 != f));
      f_01 = (DdManager *)((ulong)(pDVar1->type).kids.E ^ (long)(int)(uint)(pDVar1 != f));
      if (local_7c == dd->perm[x->index]) {
        if ((f_00 != dd_local) && (bVar2 = f_01 == dd_local, dd_local = (DdManager *)x, bVar2)) {
          dd_local = (DdManager *)dd->one;
        }
      }
      else if (f_00 == dd_local) {
        dd_local = (DdManager *)cuddBddCharToVect(dd,(DdNode *)f_01,x);
      }
      else if (f_01 == dd_local) {
        dd_local = (DdManager *)cuddBddCharToVect(dd,(DdNode *)f_00,x);
      }
      else {
        g = cuddBddCharToVect(dd,(DdNode *)f_00,x);
        if (g == (DdNode *)0x0) {
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
          h = cuddBddCharToVect(dd,(DdNode *)f_01,x);
          if (h == (DdNode *)0x0) {
            Cudd_IterDerefBdd(dd,g);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
            dd_local = (DdManager *)cuddBddIteRecur(dd,dd->vars[pDVar1->index],g,h);
            if (dd_local == (DdManager *)0x0) {
              Cudd_IterDerefBdd(dd,g);
              Cudd_IterDerefBdd(dd,h);
              dd_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + -1;
              *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + -1;
              cuddCacheInsert2(dd,cuddBddCharToVect,f,x,(DdNode *)dd_local);
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
cuddBddCharToVect(
  DdManager * dd,
  DdNode * f,
  DdNode * x)
{
    unsigned int topf;
    unsigned int level;
    int comple;

    DdNode *one, *zero, *res, *F, *fT, *fE, *T, *E;

    statLine(dd);
    /* Check the cache. */
    res = cuddCacheLookup2(dd, cuddBddCharToVect, f, x);
    if (res != NULL) {
        return(res);
    }

    F = Cudd_Regular(f);

    topf = cuddI(dd,F->index);
    level = dd->perm[x->index];

    if (topf > level) return(x);

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    comple = F != f;
    fT = Cudd_NotCond(cuddT(F),comple);
    fE = Cudd_NotCond(cuddE(F),comple);

    if (topf == level) {
        if (fT == zero) return(zero);
        if (fE == zero) return(one);
        return(x);
    }

    /* Here topf < level. */
    if (fT == zero) return(cuddBddCharToVect(dd, fE, x));
    if (fE == zero) return(cuddBddCharToVect(dd, fT, x));

    T = cuddBddCharToVect(dd, fT, x);
    if (T == NULL) {
        return(NULL);
    }
    cuddRef(T);
    E = cuddBddCharToVect(dd, fE, x);
    if (E == NULL) {
        Cudd_IterDerefBdd(dd,T);
        return(NULL);
    }
    cuddRef(E);
    res = cuddBddIteRecur(dd, dd->vars[F->index], T, E);
    if (res == NULL) {
        Cudd_IterDerefBdd(dd,T);
        Cudd_IterDerefBdd(dd,E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);
    cuddCacheInsert2(dd, cuddBddCharToVect, f, x, res);
    return(res);

}